

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

void __thiscall
draco::PointAttribute::Init
          (PointAttribute *this,Type attribute_type,int8_t num_components,DataType data_type,
          bool normalized,size_t num_attribute_values)

{
  void *num_attribute_values_00;
  pointer pDVar1;
  DataType in_ECX;
  undefined1 in_DL;
  undefined4 in_ESI;
  undefined1 in_R8B;
  pointer in_stack_ffffffffffffff88;
  unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *in_stack_ffffffffffffff90;
  DataType in_stack_ffffffffffffff98;
  uint8_t in_stack_ffffffffffffff9f;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  PointAttribute *in_stack_ffffffffffffffc8;
  Type attribute_type_00;
  
  num_attribute_values_00 = operator_new(0x28);
  DataBuffer::DataBuffer
            ((DataBuffer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::unique_ptr<draco::DataBuffer,std::default_delete<draco::DataBuffer>>::
  unique_ptr<std::default_delete<draco::DataBuffer>,void>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::operator=
            (in_stack_ffffffffffffff90,
             (unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
             in_stack_ffffffffffffff88);
  std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::~unique_ptr
            ((unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_> *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pDVar1 = std::unique_ptr<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>::get
                     (in_stack_ffffffffffffff90);
  attribute_type_00 = (Type)((ulong)pDVar1 >> 0x20);
  uVar3 = CONCAT13(in_DL,(int3)in_stack_ffffffffffffffb0);
  uVar2 = CONCAT13(in_R8B,(int3)in_stack_ffffffffffffffa0) & 0x1ffffff;
  DataTypeLength(in_ECX);
  GeometryAttribute::Init
            ((GeometryAttribute *)CONCAT44(in_ECX,uVar3),attribute_type_00,
             (DataBuffer *)CONCAT44(in_ESI,uVar2),in_stack_ffffffffffffff9f,
             in_stack_ffffffffffffff98,false,(int64_t)num_attribute_values_00,
             (int64_t)in_stack_ffffffffffffffc8);
  Reset(in_stack_ffffffffffffffc8,(size_t)num_attribute_values_00);
  SetIdentityMapping((PointAttribute *)0x1a1ca2);
  return;
}

Assistant:

void PointAttribute::Init(Type attribute_type, int8_t num_components,
                          DataType data_type, bool normalized,
                          size_t num_attribute_values) {
  attribute_buffer_ = std::unique_ptr<DataBuffer>(new DataBuffer());
  GeometryAttribute::Init(attribute_type, attribute_buffer_.get(),
                          num_components, data_type, normalized,
                          DataTypeLength(data_type) * num_components, 0);
  Reset(num_attribute_values);
  SetIdentityMapping();
}